

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acec2Mult.c
# Opt level: O0

Vec_Int_t * Sdb_StoFindAll(Vec_Wec_t *vCuts)

{
  int iVar1;
  Vec_Int_t *p;
  Vec_Int_t *p_00;
  Vec_Int_t *vAll;
  Vec_Int_t *vCut;
  undefined4 local_18;
  int Entry;
  int k;
  int i;
  Vec_Wec_t *vCuts_local;
  
  p = Vec_IntAlloc(100);
  for (Entry = 0; iVar1 = Vec_WecSize(vCuts), Entry < iVar1; Entry = Entry + 1) {
    p_00 = Vec_WecEntry(vCuts,Entry);
    for (local_18 = 0; iVar1 = Vec_IntSize(p_00), local_18 < iVar1; local_18 = local_18 + 1) {
      iVar1 = Vec_IntEntry(p_00,local_18);
      Vec_IntPushUnique(p,iVar1);
    }
  }
  return p;
}

Assistant:

Vec_Int_t * Sdb_StoFindAll( Vec_Wec_t * vCuts )
{
    int i, k, Entry;
    Vec_Int_t * vCut, * vAll = Vec_IntAlloc( 100 );  
    Vec_WecForEachLevel( vCuts, vCut, i )
        Vec_IntForEachEntry( vCut, Entry, k )
            Vec_IntPushUnique( vAll, Entry );
    return vAll;
}